

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_common.c
# Opt level: O1

void epoxy_glBegin_wrapped(GLenum primtype)

{
  pthread_mutex_lock((pthread_mutex_t *)&api);
  api.begin_count = api.begin_count + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&api);
  (*epoxy_glBegin_unwrapped)(primtype);
  return;
}

Assistant:

WRAPPER_VISIBILITY (void)
WRAPPER(epoxy_glBegin)(GLenum primtype)
{
#ifdef _WIN32
    InterlockedIncrement(&api.begin_count);
#else
    pthread_mutex_lock(&api.mutex);
    api.begin_count++;
    pthread_mutex_unlock(&api.mutex);
#endif

    epoxy_glBegin_unwrapped(primtype);
}